

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix33.h
# Opt level: O2

void __thiscall
chrono::ChMatrix33<double>::Set_A_Hpb(ChMatrix33<double> *this,ChVector<double> *angles)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ulong extraout_XMM0_Qb;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_var [56];
  
  dVar1 = cos(angles->m_data[1]);
  dVar2 = cos(angles->m_data[0]);
  dVar3 = cos(angles->m_data[2]);
  dVar4 = sin(angles->m_data[1]);
  dVar5 = sin(angles->m_data[0]);
  auVar6._0_8_ = sin(angles->m_data[2]);
  auVar6._8_56_ = extraout_var;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar5;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar5 * dVar4 * auVar6._0_8_;
  auVar8 = vfmsub231sd_fma(auVar8,auVar10,auVar13);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2 * dVar4 * auVar6._0_8_;
  auVar7 = vfmadd231sd_fma(auVar7,auVar14,auVar10);
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar8._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar5 * dVar3 * dVar4;
  auVar10 = vfnmsub231sd_fma(auVar11,auVar6._0_16_,auVar13);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar2 * dVar3 * dVar4;
  auVar8 = vfnmadd231sd_fma(auVar9,auVar6._0_16_,auVar14);
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar10._0_8_;
  auVar12._0_8_ = -dVar4;
  auVar12._8_8_ = extraout_XMM0_Qb ^ 0x8000000000000000;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       dVar5 * -dVar1;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       dVar1 * auVar6._0_8_;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       dVar1 * dVar3;
  dVar3 = (double)vmovlpd_avx(auVar12);
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar3;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar7._0_8_;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar8._0_8_;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       dVar1 * dVar2;
  return;
}

Assistant:

inline void ChMatrix33<Real>::Set_A_Hpb(const ChVector<Real>& angles) {
    Real cx = std::cos(angles.y());
    Real cy = std::cos(angles.x());
    Real cz = std::cos(angles.z());
    Real sx = std::sin(angles.y());
    Real sy = std::sin(angles.x());
    Real sz = std::sin(angles.z());

    (*this)(0, 0) = (cz * cy) - (sz * sx * sy);
    (*this)(0, 1) = -(sz * cy) - (cz * sx * sy);
    (*this)(0, 2) = -cx * sy;
    (*this)(1, 0) = sz * cx;
    (*this)(1, 1) = cz * cx;
    (*this)(1, 2) = -sx;
    (*this)(2, 0) = (cz * sy) + (sz * sx * cy);
    (*this)(2, 1) = -(sz * sy) + (cz * sx * cy);
    (*this)(2, 2) = cx * cy;
}